

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

_Bool Curl_conn_cf_is_ssl(Curl_cfilter *cf)

{
  uint uVar1;
  
  if (cf == (Curl_cfilter *)0x0) {
    return false;
  }
  do {
    uVar1 = cf->cft->flags;
    if ((uVar1 & 3) != 0) break;
    cf = cf->next;
  } while (cf != (Curl_cfilter *)0x0);
  return SUB41((uVar1 & 2) >> 1,0);
}

Assistant:

bool Curl_conn_cf_is_ssl(struct Curl_cfilter *cf)
{
  for(; cf; cf = cf->next) {
    if(cf->cft->flags & CF_TYPE_SSL)
      return TRUE;
    if(cf->cft->flags & CF_TYPE_IP_CONNECT)
      return FALSE;
  }
  return FALSE;
}